

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O3

void __thiscall VMStack::addFrame(VMStack *this,Frame *frame)

{
  iterator *piVar1;
  _Elt_pointer ppFVar2;
  Frame *local_8;
  
  ppFVar2 = (this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppFVar2 ==
      (this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    local_8 = frame;
    std::deque<Frame*,std::allocator<Frame*>>::_M_push_back_aux<Frame*const&>
              ((deque<Frame*,std::allocator<Frame*>> *)this,&local_8);
  }
  else {
    *ppFVar2 = frame;
    piVar1 = &(this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void VMStack::addFrame(Frame *frame) {
    // Verifica se a stack está cheia
//    if (_frameStack.size() >= FRAME_MAX_SIZE) {
//        cerr << "StackOverflowError" << endl;
//        exit(1);
//    }
    
    _frameStack.push(frame);
}